

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O2

void xercesc_4_0::XTemplateSerializer::storeObject
               (RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>
                *objToStore,XSerializeEngine *serEng)

{
  bool bVar1;
  void *key;
  XercesAttGroupInfo *pXVar2;
  RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> *__n;
  void *__buf;
  XMLSize_t t;
  RefHashTableOfEnumerator<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> e;
  RefHashTableOfEnumerator<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> local_50;
  
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar1) {
    XSerializeEngine::writeSize(serEng,objToStore->fHashModulus);
    t = 0;
    RefHashTableOfEnumerator<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>::
    RefHashTableOfEnumerator(&local_50,objToStore,false,objToStore->fMemoryManager);
    while ((local_50.fCurElem != (RefHashTableBucketElem<xercesc_4_0::XercesAttGroupInfo> *)0x0 ||
           (local_50.fCurHash != (local_50.fToEnum)->fHashModulus))) {
      RefHashTableOfEnumerator<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>::
      nextElement(&local_50);
      t = t + 1;
    }
    __n = local_50.fToEnum;
    XSerializeEngine::writeSize(serEng,t);
    RefHashTableOfEnumerator<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>::Reset
              (&local_50);
    while ((local_50.fCurElem != (RefHashTableBucketElem<xercesc_4_0::XercesAttGroupInfo> *)0x0 ||
           (__n = local_50.fToEnum, local_50.fCurHash != (local_50.fToEnum)->fHashModulus))) {
      key = RefHashTableOfEnumerator<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>::
            nextElementKey(&local_50);
      pXVar2 = RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>::get
                         (objToStore,key);
      XSerializeEngine::write(serEng,(int)pXVar2,__buf,(size_t)__n);
    }
    RefHashTableOfEnumerator<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>::
    ~RefHashTableOfEnumerator(&local_50);
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(RefHashTableOf<XercesAttGroupInfo>* const objToStore
                                    , XSerializeEngine&                         serEng)
{

    if (serEng.needToStoreObject(objToStore))
    {
        serEng.writeSize (objToStore->getHashModulus());

        RefHashTableOfEnumerator<XercesAttGroupInfo> e(objToStore, false, objToStore->getMemoryManager());
        XMLSize_t itemNumber = 0;

        while (e.hasMoreElements())
        {
            e.nextElement();
            itemNumber++;
        }

        serEng.writeSize (itemNumber);
        e.Reset();

#ifdef XERCES_DEBUG_SORT_GRAMMAR
        //to sort the key
        SORT_KEYSET_ONEKEY(serEng.getMemoryManager())

        //to store the data
        for (XMLSize_t i=0; i < itemNumber; i++)
        {
            GET_NEXT_KEYSET()

            XercesAttGroupInfo* data = objToStore->get(strKey);
            serEng<<data;
        }
#else
        while (e.hasMoreElements())
        {
            XercesAttGroupInfo* data = objToStore->get(e.nextElementKey());
            serEng<<data;
        }
#endif
    }
}